

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManCnfAddDynamic(Ga2_Man_t *p,int uTruth,int *Lits,int iLitOut,int ProofId)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  int ClaLits [6];
  uint local_48 [6];
  
  uVar9 = (ulong)(uint)uTruth;
  uVar2 = 0;
  do {
    uVar10 = (ulong)(~(uint)uVar9 & 0xffff);
    if (uVar2 == 0) {
      uVar10 = uVar9;
    }
    if ('\0' < p->pSopSizes[uVar10]) {
      uVar5 = uVar2 ^ iLitOut;
      lVar8 = 0;
      do {
        iVar1 = 1;
        lVar4 = 3;
        iVar3 = (int)p->pSops[uVar10][lVar8];
        do {
          local_48[0] = uVar5;
          if (iVar3 % 3 == 1) {
            if (Lits[lVar4] < 2) {
              __assert_fail("Lits[b] > 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                            ,0x2a3,"void Ga2_ManCnfAddDynamic(Ga2_Man_t *, int, int *, int, int)");
            }
            uVar6 = Lits[lVar4] ^ 1;
LAB_0057e72d:
            lVar7 = (long)iVar1;
            iVar1 = iVar1 + 1;
            local_48[lVar7] = uVar6;
          }
          else if (iVar3 % 3 == 0) {
            uVar6 = Lits[lVar4];
            if ((int)uVar6 < 2) {
              __assert_fail("Lits[b] > 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                            ,0x29e,"void Ga2_ManCnfAddDynamic(Ga2_Man_t *, int, int *, int, int)");
            }
            goto LAB_0057e72d;
          }
          bVar11 = lVar4 != 0;
          lVar4 = lVar4 + -1;
          iVar3 = iVar3 / 3;
        } while (bVar11);
        sat_solver2_addclause(p->pSat,(lit *)local_48,(lit *)(local_48 + iVar1),ProofId);
        lVar8 = lVar8 + 1;
      } while (lVar8 < p->pSopSizes[uVar10]);
    }
    bVar11 = uVar2 != 0;
    uVar9 = uVar10;
    uVar2 = uVar2 + 1;
    if (bVar11) {
      return;
    }
  } while( true );
}

Assistant:

static inline void Ga2_ManCnfAddDynamic( Ga2_Man_t * p, int uTruth, int Lits[], int iLitOut, int ProofId )
{
    int i, k, b, Cube, nClaLits, ClaLits[6];
//    assert( uTruth > 0 && uTruth < 0xffff );
    for ( i = 0; i < 2; i++ )
    {
        if ( i )
            uTruth = 0xffff & ~uTruth;
//        Extra_PrintBinary( stdout, &uTruth, 16 ); printf( "\n" );
        for ( k = 0; k < p->pSopSizes[uTruth]; k++ )
        {
            nClaLits = 0;
            ClaLits[nClaLits++] = i ? lit_neg(iLitOut) : iLitOut;
            Cube = p->pSops[uTruth][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Cube % 3 == 0 ) // value 0 --> add positive literal
                {
                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = Lits[b];
                }
                else if ( Cube % 3 == 1 ) // value 1 --> add negative literal
                {
                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = lit_neg(Lits[b]);
                }
                Cube = Cube / 3;
            }
            sat_solver2_addclause( p->pSat, ClaLits, ClaLits+nClaLits, ProofId );
        }
    }
}